

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDEdge::TaggedEndIndex(ON_SubDEdge *this)

{
  uint uVar1;
  ulong uVar2;
  uint evi;
  ulong uVar3;
  
  uVar2 = 3;
  for (uVar3 = 0; uVar1 = (uint)uVar2, uVar3 != 2; uVar3 = uVar3 + 1) {
    if (((this->m_vertex[uVar3] != (ON_SubDVertex *)0x0) &&
        ((byte)(this->m_vertex[uVar3]->m_vertex_tag - Crease) < 3)) && (uVar2 = 2, uVar1 == 3)) {
      uVar2 = uVar3 & 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdge::TaggedEndIndex() const
{
  unsigned int tagged_end_index = 3;
  for (unsigned int evi = 0; evi < 2; evi++)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr == v || false == v->IsDartOrCreaseOrCorner())
      continue;
    tagged_end_index = (3 == tagged_end_index) ? evi : 2;
  }
  return tagged_end_index;
}